

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall DifferingTypesTest::nonBasicTypesTest(DifferingTypesTest *this)

{
  size_t base [2];
  size_t shape [2];
  unsigned_long local_a8;
  View<MyTestType,_false,_std::allocator<unsigned_long>_> v;
  Marray<MyTestType,_std::allocator<unsigned_long>_> m;
  
  shape[0] = 3;
  shape[1] = 4;
  andres::Marray<MyTestType,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<MyTestType,std::allocator<unsigned_long>> *)&m,shape,&local_a8,(MyTestType *)&v
             ,&andres::defaultOrder,(allocator_type *)base);
  base[0] = 0;
  base[1] = 0;
  shape[0] = 2;
  shape[1] = 2;
  andres::View<MyTestType,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
            (&v,(View<MyTestType,false,std::allocator<unsigned_long>> *)&m,base,shape);
  andres::View<MyTestType,false,std::allocator<unsigned_long>>::operator()
            ((View<MyTestType,false,std::allocator<unsigned_long>> *)&v,0,1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::Marray<MyTestType,_std::allocator<unsigned_long>_>::~Marray(&m);
  return;
}

Assistant:

void DifferingTypesTest::nonBasicTypesTest()
{
    std::size_t shape[] = {3, 4};
    andres::Marray<MyTestType> m(shape, shape + 2);
    std::size_t base[] = {0, 0};
    shape[0] = 2;
    shape[1] = 2;
    andres::View<MyTestType> v = m.view(base, shape);
    v(0, 1) = MyTestType();
}